

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int i)

{
  sqlite3_vtab_cursor *ppStmt;
  byte bVar1;
  sqlite3_vtab *psVar2;
  u8 *puVar3;
  sqlite3_vtab *pStmt;
  int iVar4;
  int iVar5;
  RtreeNode *pRVar6;
  sqlite3_value *pValue;
  long lVar7;
  i64 iValue;
  sqlite3_vtab *psVar8;
  MemValue val;
  Mem *pMem;
  long in_FS_OFFSET;
  int rc;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)((long)&cur[1].pVtab + 1) == '\0') {
    if (*(int *)((long)&cur[4].pVtab + 4) == 0) {
      psVar8 = (sqlite3_vtab *)0x0;
    }
    else {
      psVar8 = cur[6].pVtab;
    }
  }
  else {
    psVar8 = (sqlite3_vtab *)(cur + 8);
  }
  psVar2 = cur->pVtab;
  local_3c = 0;
  pRVar6 = rtreeNodeOfFirstSearchPoint((RtreeCursor *)cur,&local_3c);
  iVar4 = local_3c;
  if ((local_3c != 0) || (iVar4 = 0, psVar8 == (sqlite3_vtab *)0x0)) goto LAB_001f8ee9;
  puVar3 = pRVar6->zData;
  bVar1 = *(byte *)((long)&psVar8->zErrMsg + 2);
  iVar4 = 4;
  if ((ushort)(*(ushort *)(puVar3 + 2) << 8 | *(ushort *)(puVar3 + 2) >> 8) <= (ushort)bVar1)
  goto LAB_001f8ee9;
  if (i == 0) {
    val.i = readInt64(puVar3 + (ulong)((uint)(byte)psVar2[1].field_0xf * (uint)bVar1) + 4);
    pMem = ctx->pOut;
    if ((pMem->flags & 0x9000) == 0) {
      (pMem->u).i = (i64)val;
LAB_001f9079:
      pMem->flags = 4;
    }
    else {
LAB_001f8fec:
      vdbeReleaseAndSetInt64(pMem,val.i);
    }
  }
  else if ((int)(uint)(byte)psVar2[1].field_0xd < i) {
    if (*(char *)((long)&cur[1].pVtab + 2) == '\0') {
      ppStmt = cur + 7;
      if (cur[7].pVtab == (sqlite3_vtab *)0x0) {
        local_3c = sqlite3LockAndPrepare
                             ((sqlite3 *)psVar2[1].pModule,(char *)psVar2[4].pModule,-1,0x80,
                              (Vdbe *)0x0,(sqlite3_stmt **)ppStmt,(char **)0x0);
        iVar4 = local_3c;
        if (local_3c != 0) goto LAB_001f8ee9;
        local_3c = 0;
      }
      pStmt = ppStmt->pVtab;
      iValue = readInt64(pRVar6->zData +
                         (ulong)(byte)psVar2[1].field_0xf *
                         (ulong)*(byte *)((long)&psVar8->zErrMsg + 2) + 4);
      sqlite3_bind_int64((sqlite3_stmt *)pStmt,1,iValue);
      iVar5 = sqlite3_step((sqlite3_stmt *)ppStmt->pVtab);
      local_3c = iVar5;
      if (iVar5 != 100) {
        sqlite3_reset((sqlite3_stmt *)ppStmt->pVtab);
        iVar4 = local_3c;
        if (iVar5 == 0x65) {
          local_3c = 0;
          iVar4 = local_3c;
        }
        goto LAB_001f8ee9;
      }
      *(undefined1 *)((long)&cur[1].pVtab + 2) = 1;
    }
    pValue = sqlite3_column_value
                       ((sqlite3_stmt *)cur[7].pVtab,(i - (uint)(byte)psVar2[1].field_0xd) + 1);
    sqlite3_result_value(ctx,pValue);
  }
  else {
    lVar7 = (long)(int)((uint)(byte)psVar2[1].field_0xf * (uint)bVar1 + i * 4 + 8);
    val.i = (ulong)puVar3[lVar7 + 3] |
            (ulong)puVar3[lVar7 + 2] << 8 |
            (long)(int)((uint)puVar3[lVar7] << 0x18) | (ulong)puVar3[lVar7 + 1] << 0x10;
    if (psVar2[1].field_0xe != '\0') {
      pMem = ctx->pOut;
      if ((pMem->flags & 0x9000) == 0) {
        pMem->u = val;
        goto LAB_001f9079;
      }
      goto LAB_001f8fec;
    }
    sqlite3VdbeMemSetDouble(ctx->pOut,(double)(float)val.nZero);
  }
  iVar4 = 0;
LAB_001f8ee9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int rtreeColumn(sqlite3_vtab_cursor *cur, sqlite3_context *ctx, int i){
  Rtree *pRtree = (Rtree *)cur->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  RtreeCoord c;
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);

  if( rc ) return rc;
  if( NEVER(p==0) ) return SQLITE_OK;
  if( p->iCell>=NCELL(pNode) ) return SQLITE_ABORT;
  if( i==0 ){
    sqlite3_result_int64(ctx, nodeGetRowid(pRtree, pNode, p->iCell));
  }else if( i<=pRtree->nDim2 ){
    nodeGetCoord(pRtree, pNode, p->iCell, i-1, &c);
#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      sqlite3_result_double(ctx, c.f);
    }else
#endif
    {
      assert( pRtree->eCoordType==RTREE_COORD_INT32 );
      sqlite3_result_int(ctx, c.i);
    }
  }else{
    if( !pCsr->bAuxValid ){
      if( pCsr->pReadAux==0 ){
        rc = sqlite3_prepare_v3(pRtree->db, pRtree->zReadAuxSql, -1, 0,
                                &pCsr->pReadAux, 0);
        if( rc ) return rc;
      }
      sqlite3_bind_int64(pCsr->pReadAux, 1,
          nodeGetRowid(pRtree, pNode, p->iCell));
      rc = sqlite3_step(pCsr->pReadAux);
      if( rc==SQLITE_ROW ){
        pCsr->bAuxValid = 1;
      }else{
        sqlite3_reset(pCsr->pReadAux);
        if( rc==SQLITE_DONE ) rc = SQLITE_OK;
        return rc;
      }
    }
    sqlite3_result_value(ctx,
         sqlite3_column_value(pCsr->pReadAux, i - pRtree->nDim2 + 1));
  }
  return SQLITE_OK;
}